

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

int wally_is_elements_build(size_t *written)

{
  size_t *written_local;
  
  if (written == (size_t *)0x0) {
    written_local._4_4_ = -2;
  }
  else {
    *written = 1;
    written_local._4_4_ = 0;
  }
  return written_local._4_4_;
}

Assistant:

int wally_is_elements_build(size_t *written)
{
    if (!written)
        return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
    *written = 1;
#else
    *written = 0;
#endif
    return WALLY_OK;
}